

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# f77_wrap3.c
# Opt level: O2

void Cffpknl(fitsfile *fptr,char *keyroot,int nstart,int nkeys,int *numval,char **comment,
            int *status)

{
  ulong uVar1;
  ulong uVar2;
  
  ffpknl(fptr,keyroot,nstart,nkeys,numval,comment,status);
  uVar1 = 0;
  uVar2 = (ulong)(uint)nkeys;
  if (nkeys < 1) {
    uVar2 = 0;
  }
  for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    numval[uVar1] = (uint)(numval[uVar1] != 0);
  }
  return;
}

Assistant:

void Cffpknl( fitsfile *fptr, char *keyroot, int nstart, int nkeys,
              int *numval, char **comment, int *status )
{
   int i;
 
   for( i=0; i<nkeys; i++ )
      numval[i] = F2CLOGICAL(numval[i]);
   ffpknl( fptr, keyroot, nstart, nkeys, numval, comment, status );
   for( i=0; i<nkeys; i++ )
      numval[i] = C2FLOGICAL(numval[i]);
}